

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_runner_impl.hpp
# Opt level: O0

void __thiscall Catch::StreamRedirect::~StreamRedirect(StreamRedirect *this)

{
  string local_30 [32];
  StreamRedirect *local_10;
  StreamRedirect *this_local;
  
  local_10 = this;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)this->m_targetString,local_30);
  std::__cxx11::string::~string(local_30);
  std::ios::rdbuf((streambuf *)(this->m_stream + *(long *)(*(long *)this->m_stream + -0x18)));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_oss);
  return;
}

Assistant:

~StreamRedirect() {
            m_targetString += m_oss.str();
            m_stream.rdbuf( m_prevBuf );
        }